

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# encoding_function.cpp
# Opt level: O1

void duckdb::EncodingFunctionSet::Initialize(DBConfig *config)

{
  undefined1 *local_88;
  long local_80;
  undefined1 local_78 [16];
  undefined1 local_68 [16];
  _Alloc_hider local_58;
  char local_48 [16];
  code *local_38;
  idx_t local_30;
  idx_t local_28;
  
  local_88 = local_78;
  ::std::__cxx11::string::_M_construct<char_const*>((string *)&local_88,"utf-8","");
  local_68._0_8_ = 0;
  local_68._8_8_ = 0;
  local_58._M_p = local_48;
  ::std::__cxx11::string::_M_construct<char*>((string *)&local_58,local_88,local_88 + local_80);
  local_38 = DecodeUTF8;
  local_30 = 1;
  local_28 = 1;
  DBConfig::RegisterEncodeFunction(config,(EncodingFunction *)local_68);
  if (local_58._M_p != local_48) {
    operator_delete(local_58._M_p);
  }
  if (local_88 != local_78) {
    operator_delete(local_88);
  }
  local_88 = local_78;
  ::std::__cxx11::string::_M_construct<char_const*>((string *)&local_88,"latin-1","");
  local_68._0_8_ = 0;
  local_68._8_8_ = 0;
  local_58._M_p = local_48;
  ::std::__cxx11::string::_M_construct<char*>((string *)&local_58,local_88,local_88 + local_80);
  local_38 = DecodeLatin1ToUTF8;
  local_30 = 2;
  local_28 = 1;
  DBConfig::RegisterEncodeFunction(config,(EncodingFunction *)local_68);
  if (local_58._M_p != local_48) {
    operator_delete(local_58._M_p);
  }
  if (local_88 != local_78) {
    operator_delete(local_88);
  }
  local_88 = local_78;
  ::std::__cxx11::string::_M_construct<char_const*>((string *)&local_88,"utf-16","");
  local_68._0_8_ = 0;
  local_68._8_8_ = 0;
  local_58._M_p = local_48;
  ::std::__cxx11::string::_M_construct<char*>((string *)&local_58,local_88,local_88 + local_80);
  local_38 = DecodeUTF16ToUTF8;
  local_30 = 2;
  local_28 = 2;
  DBConfig::RegisterEncodeFunction(config,(EncodingFunction *)local_68);
  if (local_58._M_p != local_48) {
    operator_delete(local_58._M_p);
  }
  if (local_88 != local_78) {
    operator_delete(local_88);
  }
  return;
}

Assistant:

void EncodingFunctionSet::Initialize(DBConfig &config) {
	config.RegisterEncodeFunction({"utf-8", DecodeUTF8, 1, 1});
	config.RegisterEncodeFunction({"latin-1", DecodeLatin1ToUTF8, 2, 1});
	config.RegisterEncodeFunction({"utf-16", DecodeUTF16ToUTF8, 2, 2});
}